

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

void __thiscall icu_63::anon_unknown_4::SortKeyLevel::appendWeight32(SortKeyLevel *this,uint32_t w)

{
  int iVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  UBool UVar5;
  int32_t iVar6;
  uchar *puVar7;
  int local_30;
  int local_2c;
  int32_t appendLength;
  uint8_t bytes [4];
  uint32_t w_local;
  SortKeyLevel *this_local;
  
  uVar2 = (uchar)(w >> 0x10);
  uVar3 = (uchar)(w >> 8);
  uVar4 = (uchar)w;
  if (uVar2 == '\0') {
    local_2c = 1;
  }
  else {
    if (uVar3 == '\0') {
      local_30 = 2;
    }
    else {
      local_30 = 4;
      if (uVar4 == '\0') {
        local_30 = 3;
      }
    }
    local_2c = local_30;
  }
  iVar1 = this->len;
  iVar6 = MaybeStackArray<unsigned_char,_40>::getCapacity(&this->buffer);
  if ((iVar1 + local_2c <= iVar6) || (UVar5 = ensureCapacity(this,local_2c), UVar5 != '\0')) {
    iVar1 = this->len;
    this->len = iVar1 + 1;
    puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar1);
    *puVar7 = (uchar)(w >> 0x18);
    if (uVar2 != '\0') {
      iVar1 = this->len;
      this->len = iVar1 + 1;
      puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar1);
      *puVar7 = uVar2;
      if (uVar3 != '\0') {
        iVar1 = this->len;
        this->len = iVar1 + 1;
        puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar1);
        *puVar7 = uVar3;
        if (uVar4 != '\0') {
          iVar1 = this->len;
          this->len = iVar1 + 1;
          puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar1);
          *puVar7 = uVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void
SortKeyLevel::appendWeight32(uint32_t w) {
    U_ASSERT(w != 0);
    uint8_t bytes[4] = { (uint8_t)(w >> 24), (uint8_t)(w >> 16), (uint8_t)(w >> 8), (uint8_t)w };
    int32_t appendLength = (bytes[1] == 0) ? 1 : (bytes[2] == 0) ? 2 : (bytes[3] == 0) ? 3 : 4;
    if((len + appendLength) <= buffer.getCapacity() || ensureCapacity(appendLength)) {
        buffer[len++] = bytes[0];
        if(bytes[1] != 0) {
            buffer[len++] = bytes[1];
            if(bytes[2] != 0) {
                buffer[len++] = bytes[2];
                if(bytes[3] != 0) {
                    buffer[len++] = bytes[3];
                }
            }
        }
    }
}